

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpTool.hpp
# Opt level: O2

void __thiscall
helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this)

{
  ostream *poVar1;
  
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cout,"The execution time about ");
  poVar1 = std::operator<<(poVar1,(string *)&this->content_);
  poVar1 = std::operator<<(poVar1," is: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_unit_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&this->content_);
  std::__cxx11::string::~string((string *)&this->m_unit_);
  return;
}

Assistant:

~Timer()
    {
        auto duration = std::chrono::duration_cast<T>(std::chrono::high_resolution_clock::now()-m_t_);
        PRINTN("The execution time about "<<  content_ <<" is: " << duration.count()/times_ << " " << m_unit_);
    }